

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cpp
# Opt level: O0

string * __thiscall
pfederc::SafeExpr::toString_abi_cxx11_(string *__return_storage_ptr__,SafeExpr *this)

{
  Expr *pEVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  SafeExpr *local_18;
  SafeExpr *this_local;
  
  local_18 = this;
  this_local = (SafeExpr *)__return_storage_ptr__;
  pEVar1 = getExpression(this);
  (*pEVar1->_vptr_Expr[2])();
  std::operator+(__return_storage_ptr__,"safe ",&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string SafeExpr::toString() const noexcept {
  return "safe " + getExpression().toString();
}